

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O2

void utrie2_setRange32_63
               (UTrie2 *trie,UChar32 start,UChar32 end,uint32_t value,UBool overwrite,
               UErrorCode *pErrorCode)

{
  UNewTrie2 *trie_00;
  uint uVar1;
  int iVar2;
  int32_t iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint32_t *puVar7;
  uint32_t initialValue;
  uint uVar8;
  uint local_3c;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return;
  }
  uVar5 = (ulong)(uint)start;
  if (((end < start) || (0x10ffff < (uint)start)) || (0x10ffff < (uint)end)) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return;
  }
  trie_00 = trie->newTrie;
  if ((trie_00 == (UNewTrie2 *)0x0) || (trie_00->isCompacted != '\0')) {
    *pErrorCode = U_NO_WRITE_PERMISSION;
    return;
  }
  if ((overwrite == '\0') && (trie_00->initialValue == value)) {
    return;
  }
  uVar8 = end + 1;
  uVar4 = start & 0x1f;
  if (uVar4 != 0) {
    uVar1 = getDataBlock(trie_00,start,'\x01');
    if ((int)uVar1 < 0) goto LAB_002c433d;
    uVar6 = start + 0x1fU & 0x3fffe0;
    uVar5 = (ulong)uVar6;
    puVar7 = trie_00->data + uVar1;
    if (uVar8 < uVar6) {
      initialValue = trie_00->initialValue;
      goto LAB_002c4320;
    }
    fillBlock(puVar7,uVar4,0x20,value,trie_00->initialValue,overwrite);
  }
  if (trie_00->initialValue == value) {
    local_3c = trie_00->dataNullOffset;
  }
  else {
    local_3c = 0xffffffff;
  }
  while (uVar4 = (uint)uVar5, (int)uVar4 < (int)(uVar8 & 0x3fffe0)) {
    if (trie_00->initialValue == value) {
      if ((uVar4 & 0xfffffc00) == 0xd800) {
        iVar2 = (int)(uVar5 >> 5) + 0x140;
      }
      else {
        iVar2 = ((uint)(uVar5 >> 5) & 0x3f) + trie_00->index1[uVar5 >> 0xb];
      }
      if (trie_00->index2[iVar2] != trie_00->dataNullOffset) goto LAB_002c420f;
    }
    else {
LAB_002c420f:
      iVar3 = getIndex2Block(trie_00,uVar4,'\x01');
      if (iVar3 < 0) {
        *pErrorCode = U_INTERNAL_PROGRAM_ERROR;
        return;
      }
      uVar1 = iVar3 + ((uint)(uVar5 >> 5) & 0x3f);
      iVar2 = trie_00->index2[uVar1];
      if ((trie_00->dataNullOffset == iVar2) || (trie_00->map[iVar2 >> 5] != 1)) {
        if ((overwrite != '\0' || trie_00->dataNullOffset == iVar2) &&
           (trie_00->data[iVar2] != value)) goto LAB_002c42a1;
      }
      else if ((overwrite == '\0') || (iVar2 < 0x880)) {
        fillBlock(trie_00->data + iVar2,0,0x20,value,trie_00->initialValue,overwrite);
      }
      else {
LAB_002c42a1:
        if ((int)local_3c < 0) {
          local_3c = getDataBlock(trie_00,uVar4,'\x01');
          if ((int)local_3c < 0) goto LAB_002c433d;
          puVar7 = trie_00->data;
          for (uVar5 = 0; uVar5 < 0x80; uVar5 = uVar5 + 4) {
            *(uint32_t *)((long)puVar7 + uVar5 + (ulong)local_3c * 4) = value;
          }
        }
        else {
          setIndex2Entry(trie_00,uVar1,local_3c);
        }
      }
    }
    uVar5 = (ulong)(uVar4 + 0x20);
  }
  if ((uVar8 & 0x1f) == 0) {
    return;
  }
  uVar4 = getDataBlock(trie_00,uVar4,'\x01');
  if (-1 < (int)uVar4) {
    puVar7 = trie_00->data + uVar4;
    initialValue = trie_00->initialValue;
    uVar4 = 0;
LAB_002c4320:
    fillBlock(puVar7,uVar4,uVar8 & 0x1f,value,initialValue,overwrite);
    return;
  }
LAB_002c433d:
  *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
  return;
}

Assistant:

U_CAPI void U_EXPORT2
utrie2_set32ForLeadSurrogateCodeUnit(UTrie2 *trie,
                                     UChar32 c, uint32_t value,
                                     UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return;
    }
    if(!U_IS_LEAD(c)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    set32(trie->newTrie, c, FALSE, value, pErrorCode);
}